

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_data_converter_config *
ma_data_converter_config_init
          (ma_format formatIn,ma_format formatOut,ma_uint32 channelsIn,ma_uint32 channelsOut,
          ma_uint32 sampleRateIn,ma_uint32 sampleRateOut)

{
  ma_data_converter_config *in_RDI;
  
  if (in_RDI != (ma_data_converter_config *)0x0) {
    (in_RDI->resampling).pBackendUserData = (void *)0x0;
    *(undefined8 *)&(in_RDI->resampling).linear = 0;
    *(undefined8 *)&(in_RDI->resampling).algorithm = 0;
    (in_RDI->resampling).pBackendVTable = (ma_resampling_backend_vtable *)0x0;
    (in_RDI->resampling).format = ma_format_unknown;
    (in_RDI->resampling).channels = 0;
    (in_RDI->resampling).sampleRateIn = 0;
    (in_RDI->resampling).sampleRateOut = 0;
    in_RDI->ppChannelWeights = (float **)0x0;
    *(undefined8 *)&in_RDI->allowDynamicSampleRate = 0;
    in_RDI->ditherMode = ma_dither_mode_none;
    in_RDI->channelMixMode = ma_channel_mix_mode_default;
    *(undefined8 *)&in_RDI->calculateLFEFromSpatialChannels = 0;
    in_RDI->pChannelMapIn = (ma_channel *)0x0;
    in_RDI->pChannelMapOut = (ma_channel *)0x0;
  }
  in_RDI->ditherMode = ma_dither_mode_none;
  (in_RDI->resampling).algorithm = ma_resample_algorithm_linear;
  in_RDI->allowDynamicSampleRate = 0;
  (in_RDI->resampling).linear.lpfOrder = 1;
  in_RDI->formatIn = formatIn;
  in_RDI->formatOut = formatOut;
  in_RDI->channelsIn = channelsIn;
  in_RDI->channelsOut = channelsOut;
  in_RDI->sampleRateIn = sampleRateIn;
  in_RDI->sampleRateOut = sampleRateOut;
  return in_RDI;
}

Assistant:

MA_API ma_data_converter_config ma_data_converter_config_init(ma_format formatIn, ma_format formatOut, ma_uint32 channelsIn, ma_uint32 channelsOut, ma_uint32 sampleRateIn, ma_uint32 sampleRateOut)
{
    ma_data_converter_config config = ma_data_converter_config_init_default();
    config.formatIn      = formatIn;
    config.formatOut     = formatOut;
    config.channelsIn    = channelsIn;
    config.channelsOut   = channelsOut;
    config.sampleRateIn  = sampleRateIn;
    config.sampleRateOut = sampleRateOut;

    return config;
}